

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O0

void __thiscall MT32Emu::LA32WaveGenerator::advancePosition(LA32WaveGenerator *this)

{
  Bit32u BVar1;
  Bit32u highLinearLength_00;
  int iVar2;
  Bit32u local_2c;
  Bit32u lowLinearLength;
  Bit32u highLinearLength;
  Bit32u resonanceWaveLengthFactor;
  Bit32u effectiveCutoffValue;
  LA32WaveGenerator *this_local;
  
  BVar1 = getSampleStep(this);
  this->wavePosition = BVar1 + this->wavePosition;
  this->wavePosition = this->wavePosition & 0xfffff;
  if (this->cutoffVal < 0x2000001) {
    local_2c = 0;
  }
  else {
    local_2c = this->cutoffVal + 0xfe000000 >> 10;
  }
  BVar1 = getResonanceWaveLengthFactor(this,local_2c);
  highLinearLength_00 = getHighLinearLength(this,local_2c);
  computePositions(this,highLinearLength_00,(BVar1 * 0x100 + -0x100000) - highLinearLength_00,BVar1)
  ;
  iVar2 = 0;
  if (2 < (int)this->phase) {
    iVar2 = 2;
  }
  this->resonancePhase =
       (this->resonanceSinePosition >> 0x12) + iVar2 & NEGATIVE_RISING_RESONANCE_SINE_SEGMENT;
  return;
}

Assistant:

void LA32WaveGenerator::advancePosition() {
	wavePosition += getSampleStep();
	wavePosition %= 4 * SINE_SEGMENT_RELATIVE_LENGTH;

	Bit32u effectiveCutoffValue = (cutoffVal > MIDDLE_CUTOFF_VALUE) ? (cutoffVal - MIDDLE_CUTOFF_VALUE) >> 10 : 0;
	Bit32u resonanceWaveLengthFactor = getResonanceWaveLengthFactor(effectiveCutoffValue);
	Bit32u highLinearLength = getHighLinearLength(effectiveCutoffValue);
	Bit32u lowLinearLength = (resonanceWaveLengthFactor << 8) - 4 * SINE_SEGMENT_RELATIVE_LENGTH - highLinearLength;
	computePositions(highLinearLength, lowLinearLength, resonanceWaveLengthFactor);

	resonancePhase = ResonancePhase(((resonanceSinePosition >> 18) + (phase > POSITIVE_FALLING_SINE_SEGMENT ? 2 : 0)) & 3);
}